

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O0

bool __thiscall
QStringBuilder<const_QStringBuilder<QLatin1String,_QStringView_&>_&,_QString>::isNull
          (QStringBuilder<const_QStringBuilder<QLatin1String,_QStringView_&>_&,_QString> *this)

{
  bool bVar1;
  undefined1 local_9;
  
  bVar1 = QtStringBuilder::isNull<QStringBuilder<QLatin1String,QStringView&>>
                    ((QStringBuilder<QLatin1String,_QStringView_&> *)0x3f786e);
  local_9 = false;
  if (bVar1) {
    local_9 = QtStringBuilder::isNull<QString>((QString *)0x3f788a);
  }
  return local_9;
}

Assistant:

bool isNull() const
    {
        return QtStringBuilder::isNull(a) && QtStringBuilder::isNull(b);
    }